

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsplit.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s1;
  _Hash_node_base *p_Var1;
  _Alloc_hider _Var2;
  size_type sVar3;
  pointer pbVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  istream *piVar8;
  size_type sVar9;
  iterator iVar10;
  ostream *poVar11;
  undefined8 extraout_RAX;
  ulong uVar12;
  ulong uVar13;
  pointer pbVar14;
  __node_base _Var15;
  size_type sVar16;
  long lVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  infiles;
  string local_6b8 [32];
  string outfilename;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  bad;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> infile;
  _Hash_node_base *local_620 [4];
  string suffix;
  string prefix;
  ofstream outfile;
  stringstream ss;
  ostream local_3b0 [376];
  ifstream infile_1;
  
  infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  infiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar17 = 1;
  bVar5 = false;
  do {
    pbVar4 = infiles.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (argc <= lVar17) {
      if (infiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          infiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00104adb:
        die("No BTOR2 input file(s) specified.");
        std::__cxx11::string::~string((string *)&line);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&bad._M_h);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&lines);
        std::ifstream::~ifstream(&infile_1);
        std::__cxx11::string::~string(local_6b8);
        std::__cxx11::string::~string((string *)&infile);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&infiles);
        _Unwind_Resume(extraout_RAX);
      }
      for (pbVar14 = infiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
          pbVar14 = pbVar14 + 1) {
        std::__cxx11::string::string((string *)&infile,(string *)pbVar14);
        if (s_verbosity != 0) {
          poVar11 = std::operator<<((ostream *)&std::cout,"Processing ");
          poVar11 = std::operator<<(poVar11,(string *)&infile);
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        std::__cxx11::string::string(local_6b8,(string *)&infile);
        std::ifstream::ifstream(&infile_1,local_6b8,_S_in);
        lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        lines.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bad._M_h._M_buckets = &bad._M_h._M_single_bucket;
        bad._M_h._M_bucket_count = 1;
        bad._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        bad._M_h._M_element_count = 0;
        bad._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        bad._M_h._M_rehash_policy._M_next_resize = 0;
        bad._M_h._M_single_bucket = (__node_base_ptr)0x0;
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        while( true ) {
          piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&infile_1,(string *)&line);
          sVar3 = line._M_string_length;
          _Var2 = line._M_dataplus;
          if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
          if ((line._M_string_length != 0) && ((int)*line._M_dataplus._M_p - 0x30U < 10)) {
            uVar12 = 0;
            while ((uVar13 = line._M_string_length, line._M_string_length != uVar12 &&
                   (uVar13 = uVar12, (int)line._M_dataplus._M_p[uVar12] - 0x30U < 10))) {
              uVar12 = uVar12 + 1;
            }
            sVar16 = line._M_string_length;
            if (line._M_string_length < uVar13) {
              sVar16 = uVar13;
            }
            while ((uVar12 = sVar16, uVar13 < sVar3 &&
                   (iVar6 = isspace((int)_Var2._M_p[uVar13]), uVar12 = uVar13, iVar6 != 0))) {
              uVar13 = uVar13 + 1;
            }
            if ((((uVar12 + 3 < sVar3) && (_Var2._M_p[uVar12] == 'b')) &&
                (_Var2._M_p[uVar12 + 1] == 'a')) &&
               ((_Var2._M_p[uVar12 + 2] == 'd' &&
                (iVar6 = isspace((int)_Var2._M_p[uVar12 + 3]), iVar6 != 0)))) {
              _outfile = (long)lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)lines.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
              std::__detail::
              _Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              ::insert((_Insert<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                        *)&bad._M_h,(value_type *)&outfile);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&lines,&line);
        }
        if (bad._M_h._M_element_count < 2) {
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "Found only one property. Nothing to split");
          std::endl<char,std::char_traits<char>>(poVar11);
        }
        else {
          std::__cxx11::string::rfind((char *)local_6b8,0x10602b);
          std::__cxx11::string::substr((ulong)&prefix,(ulong)local_6b8);
          std::__cxx11::string::substr((ulong)&suffix,(ulong)local_6b8);
          if (s_verbosity != 0) {
            poVar11 = std::operator<<((ostream *)&std::cout,"Found ");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11," properties in ");
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            poVar11 = std::operator<<(poVar11," lines");
            std::endl<char,std::char_traits<char>>(poVar11);
          }
          iVar6 = 0;
          for (sVar9 = bad._M_h._M_element_count; sVar9 != 0; sVar9 = sVar9 / 10) {
            iVar6 = iVar6 + 1;
          }
          for (_Var15._M_nxt = bad._M_h._M_before_begin._M_nxt;
              _Var15._M_nxt != (_Hash_node_base *)0x0; _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt) {
            p_Var1 = _Var15._M_nxt[1]._M_nxt;
            std::__cxx11::stringstream::stringstream((stringstream *)&ss);
            poVar11 = std::operator<<(local_3b0,(string *)&prefix);
            poVar11 = std::operator<<(poVar11,"-p");
            poVar11 = std::operator<<(poVar11,0x30);
            *(long *)(poVar11 + *(long *)(*(long *)poVar11 + -0x18) + 0x10) = (long)iVar6;
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::operator<<(poVar11,(string *)&suffix);
            std::__cxx11::stringbuf::str();
            if ((!bVar5) &&
               (iVar7 = stat(outfilename._M_dataplus._M_p,(stat *)&outfile), iVar7 != -1)) {
              die("Output file %s already exists. Delete or use -f to overwrite",
                  outfilename._M_dataplus._M_p);
              goto LAB_00104adb;
            }
            std::ofstream::ofstream(&outfile,(string *)&outfilename,_S_out);
            for (local_620[0] = (_Hash_node_base *)0x0;
                local_620[0] <
                (_Hash_node_base *)
                ((long)lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)lines.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
                local_620[0] = (_Hash_node_base *)((long)&local_620[0]->_M_nxt + 1)) {
              iVar10 = std::
                       _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&bad._M_h,(key_type *)local_620);
              if ((iVar10.super__Node_iterator_base<unsigned_long,_false>._M_cur ==
                   (__node_type *)0x0) || (p_Var1 == local_620[0])) {
                poVar11 = std::operator<<((ostream *)&outfile,
                                          (string *)
                                          (lines.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                          (long)local_620[0]));
                std::endl<char,std::char_traits<char>>(poVar11);
              }
            }
            std::ofstream::close();
            if (s_verbosity != 0) {
              poVar11 = std::operator<<((ostream *)&std::cout,"Generated ");
              std::__cxx11::stringbuf::str();
              poVar11 = std::operator<<(poVar11,(string *)local_620);
              std::endl<char,std::char_traits<char>>(poVar11);
              std::__cxx11::string::~string((string *)local_620);
            }
            std::ofstream::~ofstream(&outfile);
            std::__cxx11::string::~string((string *)&outfilename);
            std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
          }
          std::__cxx11::string::~string((string *)&suffix);
          std::__cxx11::string::~string((string *)&prefix);
        }
        std::__cxx11::string::~string((string *)&line);
        std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&bad._M_h);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&lines);
        std::ifstream::~ifstream(&infile_1);
        std::__cxx11::string::~string(local_6b8);
        std::__cxx11::string::~string((string *)&infile);
      }
LAB_00104aa7:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&infiles);
      return 0;
    }
    __s1 = argv[lVar17];
    if (*__s1 == '-') {
      if ((__s1[1] == 'v') && (__s1[2] == '\0')) {
        s_verbosity = s_verbosity + 1;
      }
      else {
        if ((__s1[1] != 'f') || (__s1[2] != '\0')) {
          if ((__s1[1] != 'h') || (__s1[2] != '\0')) goto LAB_00104463;
          goto LAB_001049de;
        }
        bVar5 = true;
      }
    }
    else {
LAB_00104463:
      iVar6 = strcmp(__s1,"--help");
      if (iVar6 == 0) {
LAB_001049de:
        poVar11 = std::operator<<((ostream *)&std::cout,"Usage:");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,"  btorsplit [options] BTOR2_FILE...\n");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,"Options:");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,"  -h,--help   Print this help and exit.");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,"  -v          Increase verbosity.");
        std::endl<char,std::char_traits<char>>(poVar11);
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "  -f          Overwrite output file if it already exists.");
        std::endl<char,std::char_traits<char>>(poVar11);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "Split multi-property BTOR2 files into single property files. For each\nproperty a new file \'<basename>p[0-9]+.btor is generated"
                                 );
        std::endl<char,std::char_traits<char>>(poVar11);
        goto LAB_00104aa7;
      }
      std::__cxx11::string::string((string *)&infile_1,__s1,(allocator *)&outfile);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&infiles,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infile_1);
      std::__cxx11::string::~string((string *)&infile_1);
    }
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

int
main(int argc, char *argv[])
{
  bool overwrite = false;
  std::vector<std::string> infiles;

  for (int i = 1; i < argc; ++i)
  {
    if (!strcmp(argv[i], "-v"))
    {
      ++s_verbosity;
    }
    else if (!strcmp(argv[i], "-f"))
    {
      overwrite = true;
    }
    else if (!strcmp(argv[i], "-h") || !strcmp(argv[i], "--help"))
    {
      print_usage();
      return EXIT_SUCCESS;
    }
    else
    {
      infiles.push_back(std::string(argv[i]));
    }
  }

  if (infiles.empty())
  {
    die("No BTOR2 input file(s) specified.");
  }

  for (auto infile : infiles)
  {
    if (s_verbosity) std::cout << "Processing " << infile << std::endl;
    split_file(infile, overwrite);
  }

  return EXIT_SUCCESS;
}